

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O0

void Gia_ManShow(Gia_Man_t *pMan,Vec_Int_t *vBold,int fAdders,int fFadds,int fPath)

{
  char *pcVar1;
  Vec_Int_t *local_118;
  Vec_Int_t *local_110;
  Vec_Int_t *vAdds;
  Vec_Int_t *vXors;
  FILE *pFile;
  char FileNameDot [200];
  int fPath_local;
  int fFadds_local;
  int fAdders_local;
  Vec_Int_t *vBold_local;
  Gia_Man_t *pMan_local;
  
  vAdds = (Vec_Int_t *)0x0;
  if (fAdders == 0) {
    local_118 = (Vec_Int_t *)0x0;
  }
  else {
    local_118 = Ree_ManComputeCuts(pMan,&vAdds,0);
  }
  local_110 = local_118;
  pcVar1 = Extra_FileNameGenericAppend(pMan->pName,".dot");
  sprintf((char *)&pFile,"%s",pcVar1);
  vXors = (Vec_Int_t *)fopen((char *)&pFile,"w");
  if ((FILE *)vXors == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",&pFile);
  }
  else {
    fclose((FILE *)vXors);
    if (fPath == 0) {
      if (fAdders == 0) {
        Gia_WriteDotAigSimple(pMan,(char *)&pFile,vBold);
      }
      else {
        Gia_ShowProcess(pMan,(char *)&pFile,vBold,local_110,vAdds,fFadds);
      }
    }
    else {
      Gia_ShowPath(pMan,(char *)&pFile);
    }
    Abc_ShowFile((char *)&pFile);
    Vec_IntFreeP(&local_110);
    Vec_IntFreeP(&vAdds);
  }
  return;
}

Assistant:

void Gia_ManShow( Gia_Man_t * pMan, Vec_Int_t * vBold, int fAdders, int fFadds, int fPath )
{
    extern void Abc_ShowFile( char * FileNameDot );
    char FileNameDot[200];
    FILE * pFile;
    Vec_Int_t * vXors = NULL, * vAdds = fAdders ? Ree_ManComputeCuts( pMan, &vXors, 0 ) : NULL;
    sprintf( FileNameDot, "%s", Extra_FileNameGenericAppend(pMan->pName, ".dot") );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );
    // generate the file
    if ( fPath )
        Gia_ShowPath( pMan, FileNameDot );
    else if ( fAdders )
        Gia_ShowProcess( pMan, FileNameDot, vBold, vAdds, vXors, fFadds );
    else
        Gia_WriteDotAigSimple( pMan, FileNameDot, vBold );
    // visualize the file 
    Abc_ShowFile( FileNameDot );

    Vec_IntFreeP( &vAdds );
    Vec_IntFreeP( &vXors );
}